

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacencyTests.cpp
# Opt level: O3

void __thiscall
glcts::GeometryShaderAdjacencyTests::setTrianglePointsNonindiced
          (GeometryShaderAdjacencyTests *this,AdjacencyTestData *test_data)

{
  uint uVar1;
  AdjacencyGrid *pAVar2;
  AdjacencyGridTriangle *pAVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  GLfloat *pGVar10;
  GLfloat *pGVar11;
  GLfloat *pGVar12;
  long lVar13;
  GLuint GVar14;
  uint uVar15;
  uint uVar16;
  
  pAVar2 = test_data->m_grid;
  uVar1 = pAVar2->m_n_triangles;
  GVar14 = this->m_n_vertices_per_triangle * uVar1;
  test_data->m_n_vertices = GVar14;
  uVar16 = this->m_n_components_output * GVar14 * 4;
  test_data->m_geometry_bo_size = uVar16;
  uVar15 = GVar14 * this->m_n_components_input * 8;
  test_data->m_vertex_data_bo_size = uVar15;
  pGVar10 = (GLfloat *)operator_new__((ulong)uVar16);
  test_data->m_expected_adjacency_geometry = pGVar10;
  pGVar11 = (GLfloat *)operator_new__((ulong)uVar16);
  test_data->m_expected_geometry = pGVar11;
  pGVar12 = (GLfloat *)operator_new__((ulong)uVar15);
  test_data->m_vertex_data = pGVar12;
  if ((ulong)uVar1 != 0) {
    pAVar3 = pAVar2->m_triangles;
    lVar13 = 0;
    do {
      lVar4 = *(long *)((long)&pAVar3->m_vertex_x + lVar13);
      *(undefined4 *)((long)pGVar12 + lVar13) = *(undefined4 *)(lVar4 + 4);
      *(undefined4 *)((long)pGVar12 + lVar13 + 4) = *(undefined4 *)(lVar4 + 8);
      lVar5 = *(long *)((long)&pAVar3->m_vertex_x_adjacent + lVar13);
      *(undefined4 *)((long)pGVar12 + lVar13 + 8) = *(undefined4 *)(lVar5 + 4);
      *(undefined4 *)((long)pGVar12 + lVar13 + 0xc) = *(undefined4 *)(lVar5 + 8);
      lVar6 = *(long *)((long)&pAVar3->m_vertex_y + lVar13);
      *(undefined4 *)((long)pGVar12 + lVar13 + 0x10) = *(undefined4 *)(lVar6 + 4);
      *(undefined4 *)((long)pGVar12 + lVar13 + 0x14) = *(undefined4 *)(lVar6 + 8);
      lVar7 = *(long *)((long)&pAVar3->m_vertex_y_adjacent + lVar13);
      *(undefined4 *)((long)pGVar12 + lVar13 + 0x18) = *(undefined4 *)(lVar7 + 4);
      *(undefined4 *)((long)pGVar12 + lVar13 + 0x1c) = *(undefined4 *)(lVar7 + 8);
      lVar8 = *(long *)((long)&pAVar3->m_vertex_z + lVar13);
      *(undefined4 *)((long)pGVar12 + lVar13 + 0x20) = *(undefined4 *)(lVar8 + 4);
      *(undefined4 *)((long)pGVar12 + lVar13 + 0x24) = *(undefined4 *)(lVar8 + 8);
      lVar9 = *(long *)((long)&pAVar3->m_vertex_z_adjacent + lVar13);
      *(undefined4 *)((long)pGVar12 + lVar13 + 0x28) = *(undefined4 *)(lVar9 + 4);
      *(undefined4 *)((long)pGVar12 + lVar13 + 0x2c) = *(undefined4 *)(lVar9 + 8);
      *(undefined4 *)((long)pGVar10 + lVar13) = *(undefined4 *)(lVar5 + 4);
      *(undefined4 *)((long)pGVar10 + lVar13 + 4) = *(undefined4 *)(lVar5 + 8);
      *(undefined8 *)((long)pGVar10 + lVar13 + 8) = 0x3f80000000000000;
      *(undefined4 *)((long)pGVar10 + lVar13 + 0x10) = *(undefined4 *)(lVar7 + 4);
      *(undefined4 *)((long)pGVar10 + lVar13 + 0x14) = *(undefined4 *)(lVar7 + 8);
      *(undefined8 *)((long)pGVar10 + lVar13 + 0x18) = 0x3f80000000000000;
      *(undefined4 *)((long)pGVar10 + lVar13 + 0x20) = *(undefined4 *)(lVar9 + 4);
      *(undefined4 *)((long)pGVar10 + lVar13 + 0x24) = *(undefined4 *)(lVar9 + 8);
      *(undefined8 *)((long)pGVar10 + lVar13 + 0x28) = 0x3f80000000000000;
      *(undefined4 *)((long)pGVar11 + lVar13) = *(undefined4 *)(lVar4 + 4);
      *(undefined4 *)((long)pGVar11 + lVar13 + 4) = *(undefined4 *)(lVar4 + 8);
      *(undefined8 *)((long)pGVar11 + lVar13 + 8) = 0x3f80000000000000;
      *(undefined4 *)((long)pGVar11 + lVar13 + 0x10) = *(undefined4 *)(lVar6 + 4);
      *(undefined4 *)((long)pGVar11 + lVar13 + 0x14) = *(undefined4 *)(lVar6 + 8);
      *(undefined8 *)((long)pGVar11 + lVar13 + 0x18) = 0x3f80000000000000;
      *(undefined4 *)((long)pGVar11 + lVar13 + 0x20) = *(undefined4 *)(lVar8 + 4);
      *(undefined4 *)((long)pGVar11 + lVar13 + 0x24) = *(undefined4 *)(lVar8 + 8);
      *(undefined8 *)((long)pGVar11 + lVar13 + 0x28) = 0x3f80000000000000;
      lVar13 = lVar13 + 0x30;
    } while ((ulong)uVar1 * 0x30 != lVar13);
  }
  return;
}

Assistant:

void GeometryShaderAdjacencyTests::setTrianglePointsNonindiced(AdjacencyTestData& test_data)
{
	float* travellerExpectedAdjacencyGeometryPtr = NULL;
	float* travellerExpectedGeometryPtr			 = NULL;
	float* travellerPtr							 = NULL;

	/* Set buffer sizes */
	test_data.m_n_vertices		 = test_data.m_grid->m_n_triangles * m_n_vertices_per_triangle;
	test_data.m_geometry_bo_size = static_cast<glw::GLuint>(
		test_data.m_grid->m_n_triangles * m_n_vertices_per_triangle * m_n_components_output * sizeof(float));
	test_data.m_vertex_data_bo_size = static_cast<glw::GLuint>(test_data.m_n_vertices * m_n_components_input *
															   sizeof(float) * 2); /* include adjacency info */

	/* Allocate memory for input and expected data */
	test_data.m_expected_adjacency_geometry = new float[test_data.m_geometry_bo_size / sizeof(float)];
	test_data.m_expected_geometry			= new float[test_data.m_geometry_bo_size / sizeof(float)];
	test_data.m_vertex_data					= new float[test_data.m_vertex_data_bo_size / sizeof(float)];

	travellerExpectedAdjacencyGeometryPtr = test_data.m_expected_adjacency_geometry;
	travellerExpectedGeometryPtr		  = test_data.m_expected_geometry;
	travellerPtr						  = test_data.m_vertex_data;

	/* Set input and expected values */
	for (unsigned int n = 0; n < test_data.m_grid->m_n_triangles; ++n)
	{
		AdjacencyGridTriangle* trianglePtr = test_data.m_grid->m_triangles + n;

		*travellerPtr = trianglePtr->m_vertex_x->x;
		++travellerPtr;
		*travellerPtr = trianglePtr->m_vertex_x->y;
		++travellerPtr;
		*travellerPtr = trianglePtr->m_vertex_x_adjacent->x;
		++travellerPtr;
		*travellerPtr = trianglePtr->m_vertex_x_adjacent->y;
		++travellerPtr;
		*travellerPtr = trianglePtr->m_vertex_y->x;
		++travellerPtr;
		*travellerPtr = trianglePtr->m_vertex_y->y;
		++travellerPtr;
		*travellerPtr = trianglePtr->m_vertex_y_adjacent->x;
		++travellerPtr;
		*travellerPtr = trianglePtr->m_vertex_y_adjacent->y;
		++travellerPtr;
		*travellerPtr = trianglePtr->m_vertex_z->x;
		++travellerPtr;
		*travellerPtr = trianglePtr->m_vertex_z->y;
		++travellerPtr;
		*travellerPtr = trianglePtr->m_vertex_z_adjacent->x;
		++travellerPtr;
		*travellerPtr = trianglePtr->m_vertex_z_adjacent->y;
		++travellerPtr;

		*travellerExpectedAdjacencyGeometryPtr = trianglePtr->m_vertex_x_adjacent->x;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = trianglePtr->m_vertex_x_adjacent->y;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 0;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 1;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = trianglePtr->m_vertex_y_adjacent->x;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = trianglePtr->m_vertex_y_adjacent->y;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 0;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 1;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = trianglePtr->m_vertex_z_adjacent->x;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = trianglePtr->m_vertex_z_adjacent->y;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 0;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 1;
		++travellerExpectedAdjacencyGeometryPtr;

		*travellerExpectedGeometryPtr = trianglePtr->m_vertex_x->x;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = trianglePtr->m_vertex_x->y;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 0;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 1;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = trianglePtr->m_vertex_y->x;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = trianglePtr->m_vertex_y->y;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 0;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 1;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = trianglePtr->m_vertex_z->x;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = trianglePtr->m_vertex_z->y;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 0;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 1;
		++travellerExpectedGeometryPtr;
	} /* for (all triangles) */
}